

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O1

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,While *while_stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  ErrorReporter *this_00;
  bool bVar3;
  string local_40;
  
  peVar1 = (while_stmt->condition_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  (*peVar1->_vptr_Expr[2])(peVar1,this);
  bVar3 = IsIntegerType((while_stmt->condition_).
                        super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (!bVar3) {
    peVar1 = (while_stmt->condition_).super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 != (element_type *)0x0) {
      bVar3 = Type::IsPointer(&peVar1->type_);
      if (bVar3) goto LAB_00129d6f;
    }
    this_00 = this->reporter_;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Used not-scalar where scalar is required","");
    ErrorReporter::Report(this_00,&local_40,&(while_stmt->super_Stmt).token_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
LAB_00129d6f:
  peVar2 = (while_stmt->loop_block_).super___shared_ptr<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_Stmt[2])(peVar2,this);
  return;
}

Assistant:

void TypeChecker::Visit(While& while_stmt) {
  while_stmt.condition_->Accept(*this);

  if (!IsIntegerType(while_stmt.condition_.get()) && !IsPointer(while_stmt.condition_.get())) {
    reporter_.Report("Used not-scalar where scalar is required", while_stmt.token_);
    return;
  }

  while_stmt.loop_block_->Accept(*this);
}